

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ScriptFunctionType * __thiscall Js::FunctionProxy::AllocDeferredPrototypeType(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptFunctionType *ptr;
  
  if ((this->deferredPrototypeType).ptr != (ScriptFunctionType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x83a,"(deferredPrototypeType == nullptr)",
                                "deferredPrototypeType == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ptr = ScriptFunctionType::New(this,true);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierSet(&this->deferredPrototypeType,ptr)
  ;
  return ptr;
}

Assistant:

ScriptFunctionType * FunctionProxy::AllocDeferredPrototypeType()
    {
        Assert(deferredPrototypeType == nullptr);
        ScriptFunctionType * type = ScriptFunctionType::New(this, true);
        deferredPrototypeType = type;
        return type;
    }